

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerVk.cpp
# Opt level: O2

void __thiscall
Diligent::anon_unknown_77::BindResourceHelper::operator()
          (BindResourceHelper *this,BindResourceInfo *BindInfo)

{
  DescriptorType DVar1;
  IObject *pObj;
  PipelineResourceDesc *Args_6;
  IDeviceObject *pIVar2;
  ShaderResourceCacheVk *pSVar3;
  IDeviceObject *pIVar4;
  RefCntAutoPtr<Diligent::TextureViewVkImpl> RVar5;
  BUFFER_VIEW_TYPE BVar6;
  bool bVar7;
  Resource *pRVar8;
  PipelineResourceDesc *pPVar9;
  PipelineResourceAttribsType *pPVar10;
  RenderDeviceVkImpl *pRVar11;
  char (*in_RCX) [36];
  BufferViewVkImpl *pBVar12;
  char *pViewImpl;
  TextureViewVkImpl *pViewImpl_00;
  undefined1 uVar13;
  long lVar14;
  string *this_00;
  Uint32 ArrayIndex;
  char *in_R8;
  Uint64 UVar15;
  char (*in_R9) [205];
  initializer_list<Diligent::BUFFER_VIEW_TYPE> ExpectedViewTypes;
  initializer_list<Diligent::BUFFER_VIEW_TYPE> ExpectedViewTypes_00;
  char *pcVar16;
  RefCntAutoPtr<Diligent::TextureViewVkImpl> pTexViewVk0;
  string msg;
  RefCntAutoPtr<Diligent::BufferViewVkImpl> pBufferViewVk;
  undefined1 local_49;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  
  if (this->m_ArrayIndex != BindInfo->ArrayIndex) {
    FormatString<char[26],char[36]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_ArrayIndex == BindInfo.ArrayIndex",in_RCX);
    in_RCX = (char (*) [36])0x141;
    DebugAssertionFailed
              ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),"operator()",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0x141);
    std::__cxx11::string::~string((string *)&msg);
  }
  pObj = &BindInfo->pObject->super_IObject;
  if (pObj == (IObject *)0x0) {
    if ((((this->m_DstRes->pObject).m_pObject != (IDeviceObject *)0x0) &&
        (this->m_ResDesc->VarType != SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC)) &&
       ((BindInfo->Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) ==
        SET_SHADER_RESOURCE_FLAG_NONE)) {
      FormatString<char[18],char_const*,char[100],char[205]>
                (&msg,(Diligent *)"Shader variable \'",(char (*) [18])this->m_ResDesc,
                 (char **)
                 "\' is not dynamic, but is being reset to null. This is an error and may cause unpredicted behavior. "
                 ,(char (*) [100])
                  "If this is intended and you ensured proper synchronization, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. Otherwise, use another shader resource binding instance or label the variable as dynamic."
                 ,in_R9);
      DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                 "operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0x180);
      std::__cxx11::string::~string((string *)&msg);
    }
    ShaderResourceCacheVk::ResetResource
              (this->m_ResourceCache,(uint)((ulong)*(undefined8 *)this->m_Attribs >> 0x3e) & 1,
               this->m_DstResCacheOffset);
    return;
  }
  DVar1 = this->m_DstRes->Type;
  switch(DVar1) {
  case Sampler:
    if (-1 < *(long *)this->m_Attribs) {
      RefCntAutoPtr<Diligent::SamplerVkImpl>::RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::SamplerVkImpl> *)&pTexViewVk0,pObj,
                 (INTERFACE_ID *)IID_Sampler);
      VerifySamplerBinding<Diligent::SamplerVkImpl>
                (this->m_ResDesc,BindInfo,(SamplerVkImpl *)pTexViewVk0.m_pObject,
                 (this->m_DstRes->pObject).m_pObject,
                 (this->m_Signature->
                 super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                 .m_Desc.super_DeviceObjectAttribs.Name);
      if (pTexViewVk0.m_pObject != (TextureViewVkImpl *)0x0) {
        pRVar8 = this->m_DstRes;
        if ((((pRVar8->pObject).m_pObject == (IDeviceObject *)0x0) ||
            ((BindInfo->Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) !=
             SET_SHADER_RESOURCE_FLAG_NONE)) ||
           (this->m_ResDesc->VarType == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC)) {
          pSVar3 = this->m_ResourceCache;
          pRVar11 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                    ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                 *)this->m_Signature);
          msg._M_string_length = (size_type)pTexViewVk0;
          msg._M_dataplus._M_p._0_4_ = (uint)*(undefined8 *)this->m_Attribs & 0xffff;
          msg._M_dataplus._M_p._4_4_ = this->m_ArrayIndex;
          pTexViewVk0.m_pObject = (TextureViewVkImpl *)0x0;
          pBufferViewVk.m_pObject = (BufferViewVkImpl *)0x0;
          msg.field_2._M_allocated_capacity = 0;
          msg.field_2._8_8_ = 0;
          ShaderResourceCacheVk::SetResource
                    (pSVar3,(pRVar11->m_LogicalVkDevice).
                            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr,(uint)((ulong)*(undefined8 *)this->m_Attribs >> 0x3e) & 1,
                     this->m_DstResCacheOffset,(SetResourceInfo *)&msg);
          RefCntAutoPtr<Diligent::IDeviceObject>::Release
                    ((RefCntAutoPtr<Diligent::IDeviceObject> *)&msg._M_string_length);
          RefCntAutoPtr<Diligent::IDeviceObject>::Release
                    ((RefCntAutoPtr<Diligent::IDeviceObject> *)&pBufferViewVk);
        }
        else {
          RefCntAutoPtr<Diligent::IDeviceObject>::RefCntAutoPtr
                    ((RefCntAutoPtr<Diligent::IDeviceObject> *)&msg,
                     (IDeviceObject *)pTexViewVk0.m_pObject);
          pIVar2 = (pRVar8->pObject).m_pObject;
          pIVar4 = (IDeviceObject *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p);
          RefCntAutoPtr<Diligent::IDeviceObject>::Release
                    ((RefCntAutoPtr<Diligent::IDeviceObject> *)&msg);
          if (pIVar2 != pIVar4) {
            FormatString<char[64]>
                      (&msg,(char (*) [64])
                            "Binding another object to a non-dynamic variable is not allowed");
            DebugAssertionFailed
                      ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                       "UpdateCachedResource",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                       ,0x192);
            std::__cxx11::string::~string((string *)&msg);
          }
        }
      }
      RefCntAutoPtr<Diligent::SamplerVkImpl>::Release
                ((RefCntAutoPtr<Diligent::SamplerVkImpl> *)&pTexViewVk0);
      return;
    }
    pBufferViewVk.m_pObject._0_1_ = 0x27;
    FormatString<char[57],char_const*,char>
              (&msg,(Diligent *)"Attempting to assign a sampler to an immutable sampler \'",
               (char (*) [57])this->m_ResDesc,(char **)&pBufferViewVk,in_R8);
    DebugAssertionFailed
              ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),"operator()",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0x169);
    break;
  case CombinedImageSampler:
  case SeparateImage:
  case StorageImage:
    pcVar16 = (char *)0x23edfb;
    RefCntAutoPtr<Diligent::TextureViewVkImpl>::RefCntAutoPtr
              (&pTexViewVk0,pObj,(INTERFACE_ID *)IID_TextureViewVk);
    pRVar8 = this->m_DstRes;
    DVar1 = pRVar8->Type;
    if (DVar1 < 0xf) {
      if ((0x6006U >> (DVar1 & 0x1f) & 1) == 0) {
        uVar13 = 5;
        if (DVar1 != StorageImage) goto LAB_0023f3f6;
      }
      else {
        uVar13 = 1;
      }
    }
    else {
LAB_0023f3f6:
      FormatString<char[45]>(&msg,(char (*) [45])"Unsupported descriptor type for texture view");
      DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                 "DvpDescriptorTypeToTextureView",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0xe2);
      pcVar16 = (char *)0x23f42e;
      std::__cxx11::string::~string((string *)&msg);
      pRVar8 = this->m_DstRes;
      uVar13 = 0;
    }
    pViewImpl = (char *)&msg;
    msg._M_dataplus._M_p._0_1_ = uVar13;
    UVar15 = 1;
    VerifyResourceViewBinding<Diligent::TextureViewVkImpl,Diligent::TEXTURE_VIEW_TYPE>
              ((Diligent *)this->m_ResDesc,(PipelineResourceDesc *)BindInfo,
               (BindResourceInfo *)pTexViewVk0.m_pObject,(TextureViewVkImpl *)pViewImpl,
               (initializer_list<Diligent::TEXTURE_VIEW_TYPE>)ZEXT816(1),RESOURCE_DIM_UNDEFINED,
               SUB81((pRVar8->pObject).m_pObject,0),
               (IDeviceObject *)
               (this->m_Signature->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
               ).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,pcVar16);
    RVar5 = pTexViewVk0;
    bVar7 = UpdateCachedResource<Diligent::TextureViewVkImpl>
                      (this,&pTexViewVk0,BindInfo->Flags,(Uint64)pViewImpl,UVar15);
    this_00 = (string *)&pTexViewVk0;
    if (bVar7) {
      if (((this->m_DstRes->Type == CombinedImageSampler) && (-1 < *(long *)this->m_Attribs)) &&
         (((RVar5.m_pObject)->super_TextureViewBase<Diligent::EngineVkImplTraits>).m_pSampler.
          m_pObject == (ISampler *)0x0)) {
        GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                  ((String *)&pBufferViewVk,this->m_ResDesc,this->m_ArrayIndex);
        pViewImpl = "\' to variable \'";
        FormatString<char[29],char_const*,char[16],std::__cxx11::string,char[38]>
                  (&msg,(Diligent *)"Error binding texture view \'",
                   (char (*) [29])
                   &((RVar5.m_pObject)->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                    super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                    .m_Desc,(char **)"\' to variable \'",(char (*) [16])&pBufferViewVk,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\'. No sampler is assigned to the view",(char (*) [38])pTexViewVk0.m_pObject);
        std::__cxx11::string::~string((string *)&pBufferViewVk);
        if (DebugMessageCallback != (undefined *)0x0) {
          pViewImpl = (char *)0x0;
          (*(code *)DebugMessageCallback)
                    (2,CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),0);
        }
        std::__cxx11::string::~string((string *)&msg);
      }
      lVar14 = *(long *)this->m_Attribs;
      this_00 = (string *)&pTexViewVk0;
      if ((~(uint)lVar14 & 0xffff0000) != 0) {
        if (this->m_DstRes->Type != SeparateImage) {
          FormatString<char[96]>
                    (&msg,(char (*) [96])
                          "Only separate images can be assigned separate samplers when using HLSL-style combined samplers."
                    );
          pViewImpl = (char *)0x21d;
          DebugAssertionFailed
                    ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                     "CacheImage",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                     ,0x21d);
          std::__cxx11::string::~string((string *)&msg);
          lVar14 = *(long *)this->m_Attribs;
        }
        if (lVar14 < 0) {
          FormatString<char[55]>
                    (&msg,(char (*) [55])"Separate image can\'t be assigned an immutable sampler.");
          pViewImpl = (char *)0x21e;
          DebugAssertionFailed
                    ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                     "CacheImage",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                     ,0x21e);
          std::__cxx11::string::~string((string *)&msg);
          lVar14 = *(long *)this->m_Attribs;
        }
        pPVar9 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                           (&this->m_Signature->
                             super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                            (uint)((ulong)lVar14 >> 0x10) & 0xffff);
        pPVar10 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                            (&this->m_Signature->
                              super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>,
                             (uint)*(ushort *)&this->m_Attribs->field_0x2);
        if (pPVar9->ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) {
          FormatString<char[26],char[60]>
                    (&msg,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"SamplerResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER",
                     (char (*) [60])pViewImpl);
          DebugAssertionFailed
                    ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                     "CacheImage",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                     ,0x222);
          std::__cxx11::string::~string((string *)&msg);
        }
        this_00 = (string *)&pTexViewVk0;
        if (-1 < *(long *)pPVar10) {
          pBVar12 = (BufferViewVkImpl *)
                    ((RVar5.m_pObject)->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                    m_pSampler.m_pObject;
          if (pBVar12 == (BufferViewVkImpl *)0x0) {
            GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                      ((String *)&pBufferViewVk,this->m_ResDesc,this->m_ArrayIndex);
            local_49 = 0x27;
            FormatString<char[45],char_const*,char[31],std::__cxx11::string,char[39],char_const*,char>
                      (&msg,(Diligent *)"Failed to bind sampler to sampler variable \'",
                       (char (*) [45])pPVar9,(char **)"\' assigned to separate image \'",
                       (char (*) [31])&pBufferViewVk,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "\': no sampler is set in texture view \'",
                       (char (*) [39])
                       &((RVar5.m_pObject)->super_TextureViewBase<Diligent::EngineVkImplTraits>).
                        super_DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                        .m_Desc,(char **)&local_49,(char *)pTexViewVk0.m_pObject);
            std::__cxx11::string::~string((string *)&pBufferViewVk);
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)
                        (2,CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),0,0,0);
            }
            std::__cxx11::string::~string((string *)&msg);
            this_00 = (string *)&pTexViewVk0;
          }
          else {
            bVar7 = true;
            if (pPVar9->ArraySize != 1) {
              Args_6 = this->m_ResDesc;
              if (pPVar9->ArraySize == Args_6->ArraySize) {
                bVar7 = false;
              }
              else {
                FormatString<char[13],unsigned_int,char[33],char_const*,char[46],unsigned_int,char[31],char_const*,char[20]>
                          (&msg,(Diligent *)"Array size (",(char (*) [13])&pPVar9->ArraySize,
                           (uint *)") of separate sampler variable \'",(char (*) [33])pPVar9,
                           (char **)"\' must be one or the same as the array size (",
                           (char (*) [46])&Args_6->ArraySize,
                           (uint *)") of separate image variable \'",(char (*) [31])Args_6,
                           (char **)"\' it is assigned to",(char (*) [20])pTexViewVk0.m_pObject);
                DebugAssertionFailed
                          ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                           "CacheImage",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                           ,0x22d);
                std::__cxx11::string::~string((string *)&msg);
                bVar7 = pPVar9->ArraySize == 1;
              }
            }
            ArrayIndex = 0;
            if (!bVar7) {
              ArrayIndex = this->m_ArrayIndex;
            }
            BindResourceHelper((BindResourceHelper *)&msg,this->m_Signature,this->m_ResourceCache,
                               (uint)*(ushort *)&this->m_Attribs->field_0x2,ArrayIndex);
            pBufferViewVk.m_pObject = pBVar12;
            operator()((BindResourceHelper *)&msg,(BindResourceInfo *)&pBufferViewVk);
            this_00 = (string *)&pTexViewVk0;
          }
        }
      }
    }
LAB_0023f6c4:
    RefCntAutoPtr<Diligent::TextureViewVkImpl>::Release
              ((RefCntAutoPtr<Diligent::TextureViewVkImpl> *)this_00);
    return;
  case UniformTexelBuffer:
  case StorageTexelBuffer:
  case StorageTexelBuffer_ReadOnly:
    RefCntAutoPtr<Diligent::BufferViewVkImpl>::RefCntAutoPtr
              (&pBufferViewVk,pObj,(INTERFACE_ID *)IID_BufferViewVk);
    pcVar16 = (char *)0x23ed41;
    BVar6 = DvpDescriptorTypeToBufferView(this->m_DstRes->Type);
    pBVar12 = (BufferViewVkImpl *)&msg;
    msg._M_dataplus._M_p._0_1_ = BVar6;
    UVar15 = 1;
    ExpectedViewTypes_00._M_len = 1;
    ExpectedViewTypes_00._M_array = (iterator)0x1;
    VerifyResourceViewBinding<Diligent::BufferViewVkImpl,Diligent::BUFFER_VIEW_TYPE>
              ((Diligent *)this->m_ResDesc,(PipelineResourceDesc *)BindInfo,
               (BindResourceInfo *)pBufferViewVk.m_pObject,pBVar12,ExpectedViewTypes_00,
               RESOURCE_DIM_UNDEFINED,SUB81((this->m_DstRes->pObject).m_pObject,0),
               (IDeviceObject *)
               (this->m_Signature->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
               ).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,pcVar16);
    pPVar9 = this->m_ResDesc;
    if ((pPVar9->Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) == PIPELINE_RESOURCE_FLAG_NONE) {
      FormatString<char[92]>
                (&msg,(char (*) [92])
                      "FORMATTED_BUFFER resource flag is not set for a texel buffer - this should\'ve not happened."
                );
      pBVar12 = (BufferViewVkImpl *)0x1ee;
      DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                 "CacheTexelBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0x1ee);
      std::__cxx11::string::~string((string *)&msg);
      pPVar9 = this->m_ResDesc;
    }
    ValidateBufferMode<Diligent::BufferViewVkImpl>
              (pPVar9,this->m_ArrayIndex,pBufferViewVk.m_pObject);
    UpdateCachedResource<Diligent::BufferViewVkImpl>
              (this,&pBufferViewVk,BindInfo->Flags,(Uint64)pBVar12,UVar15);
    goto LAB_0023eddd;
  case UniformBuffer:
  case UniformBufferDynamic:
    RefCntAutoPtr<Diligent::BufferVkImpl>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::BufferVkImpl> *)&pTexViewVk0,pObj,
               (INTERFACE_ID *)IID_BufferVk);
    pRVar8 = this->m_DstRes;
    VerifyConstantBufferBinding<Diligent::BufferVkImpl>
              (this->m_ResDesc,BindInfo,(BufferVkImpl *)pTexViewVk0.m_pObject,
               (pRVar8->pObject).m_pObject,pRVar8->BufferBaseOffset,pRVar8->BufferRangeSize,
               (this->m_Signature->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
               ).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name);
    if (pTexViewVk0.m_pObject != (TextureViewVkImpl *)0x0) {
      pRVar8 = this->m_DstRes;
      if ((((pRVar8->pObject).m_pObject == (IDeviceObject *)0x0) ||
          ((BindInfo->Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) !=
           SET_SHADER_RESOURCE_FLAG_NONE)) ||
         (this->m_ResDesc->VarType == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC)) {
        pSVar3 = this->m_ResourceCache;
        local_48 = (element_type *)BindInfo->BufferBaseOffset;
        _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)BindInfo->BufferRangeSize;
        pRVar11 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                  ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                               *)this->m_Signature);
        msg._M_string_length = (size_type)pTexViewVk0;
        msg._M_dataplus._M_p._0_4_ = (uint)*(undefined8 *)this->m_Attribs & 0xffff;
        msg._M_dataplus._M_p._4_4_ = this->m_ArrayIndex;
        pTexViewVk0.m_pObject = (TextureViewVkImpl *)0x0;
        pBufferViewVk.m_pObject = (BufferViewVkImpl *)0x0;
        msg.field_2._M_allocated_capacity = (size_type)local_48;
        msg.field_2._8_8_ = _Stack_40._M_pi;
        ShaderResourceCacheVk::SetResource
                  (pSVar3,(pRVar11->m_LogicalVkDevice).
                          super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,(uint)((ulong)*(undefined8 *)this->m_Attribs >> 0x3e) & 1,
                   this->m_DstResCacheOffset,(SetResourceInfo *)&msg);
        RefCntAutoPtr<Diligent::IDeviceObject>::Release
                  ((RefCntAutoPtr<Diligent::IDeviceObject> *)&msg._M_string_length);
        RefCntAutoPtr<Diligent::IDeviceObject>::Release
                  ((RefCntAutoPtr<Diligent::IDeviceObject> *)&pBufferViewVk);
      }
      else {
        RefCntAutoPtr<Diligent::IDeviceObject>::RefCntAutoPtr
                  ((RefCntAutoPtr<Diligent::IDeviceObject> *)&msg,
                   (IDeviceObject *)pTexViewVk0.m_pObject);
        pIVar2 = (pRVar8->pObject).m_pObject;
        pIVar4 = (IDeviceObject *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p);
        RefCntAutoPtr<Diligent::IDeviceObject>::Release
                  ((RefCntAutoPtr<Diligent::IDeviceObject> *)&msg);
        if (pIVar2 != pIVar4) {
          FormatString<char[64]>
                    (&msg,(char (*) [64])
                          "Binding another object to a non-dynamic variable is not allowed");
          DebugAssertionFailed
                    ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                     "UpdateCachedResource",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                     ,0x192);
          std::__cxx11::string::~string((string *)&msg);
        }
      }
    }
    RefCntAutoPtr<Diligent::BufferVkImpl>::Release
              ((RefCntAutoPtr<Diligent::BufferVkImpl> *)&pTexViewVk0);
    return;
  case StorageBuffer:
  case StorageBuffer_ReadOnly:
  case StorageBufferDynamic:
  case StorageBufferDynamic_ReadOnly:
    RefCntAutoPtr<Diligent::BufferViewVkImpl>::RefCntAutoPtr
              (&pBufferViewVk,pObj,(INTERFACE_ID *)IID_BufferViewVk);
    pcVar16 = (char *)0x23ec05;
    BVar6 = DvpDescriptorTypeToBufferView(this->m_DstRes->Type);
    pBVar12 = (BufferViewVkImpl *)&msg;
    msg._M_dataplus._M_p._0_1_ = BVar6;
    UVar15 = 1;
    ExpectedViewTypes._M_len = 1;
    ExpectedViewTypes._M_array = (iterator)0x1;
    VerifyResourceViewBinding<Diligent::BufferViewVkImpl,Diligent::BUFFER_VIEW_TYPE>
              ((Diligent *)this->m_ResDesc,(PipelineResourceDesc *)BindInfo,
               (BindResourceInfo *)pBufferViewVk.m_pObject,pBVar12,ExpectedViewTypes,
               RESOURCE_DIM_UNDEFINED,SUB81((this->m_DstRes->pObject).m_pObject,0),
               (IDeviceObject *)
               (this->m_Signature->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
               ).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,pcVar16);
    pPVar9 = this->m_ResDesc;
    if ((pPVar9->Flags & PIPELINE_RESOURCE_FLAG_FORMATTED_BUFFER) != PIPELINE_RESOURCE_FLAG_NONE) {
      FormatString<char[90]>
                (&msg,(char (*) [90])
                      "FORMATTED_BUFFER resource flag is set for a storage buffer - this should\'ve not happened."
                );
      pBVar12 = (BufferViewVkImpl *)0x1d1;
      DebugAssertionFailed
                ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                 "CacheStorageBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                 ,0x1d1);
      std::__cxx11::string::~string((string *)&msg);
      pPVar9 = this->m_ResDesc;
    }
    ValidateBufferMode<Diligent::BufferViewVkImpl>
              (pPVar9,this->m_ArrayIndex,pBufferViewVk.m_pObject);
    UpdateCachedResource<Diligent::BufferViewVkImpl>
              (this,&pBufferViewVk,BindInfo->Flags,(Uint64)pBVar12,UVar15);
LAB_0023eddd:
    RefCntAutoPtr<Diligent::BufferViewVkImpl>::Release(&pBufferViewVk);
    return;
  case InputAttachment:
  case InputAttachment_General:
    pcVar16 = (char *)0x23f055;
    RefCntAutoPtr<Diligent::TextureViewVkImpl>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::TextureViewVkImpl> *)&msg,pObj,
               (INTERFACE_ID *)IID_TextureViewVk);
    pViewImpl_00 = (TextureViewVkImpl *)&pBufferViewVk;
    pBufferViewVk.m_pObject._0_1_ = 1;
    UVar15 = 1;
    VerifyResourceViewBinding<Diligent::TextureViewVkImpl,Diligent::TEXTURE_VIEW_TYPE>
              ((Diligent *)this->m_ResDesc,(PipelineResourceDesc *)BindInfo,
               (BindResourceInfo *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
               pViewImpl_00,(initializer_list<Diligent::TEXTURE_VIEW_TYPE>)ZEXT816(1),
               RESOURCE_DIM_UNDEFINED,SUB81((this->m_DstRes->pObject).m_pObject,0),
               (IDeviceObject *)
               (this->m_Signature->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
               ).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,pcVar16);
    UpdateCachedResource<Diligent::TextureViewVkImpl>
              (this,(RefCntAutoPtr<Diligent::TextureViewVkImpl> *)&msg,BindInfo->Flags,
               (Uint64)pViewImpl_00,UVar15);
    this_00 = &msg;
    goto LAB_0023f6c4;
  case AccelerationStructure:
    RefCntAutoPtr<Diligent::TopLevelASVkImpl>::RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::TopLevelASVkImpl> *)&pTexViewVk0,pObj,
               (INTERFACE_ID *)IID_TopLevelASVk);
    VerifyTLASResourceBinding<Diligent::TopLevelASVkImpl>
              (this->m_ResDesc,BindInfo,(TopLevelASVkImpl *)pTexViewVk0.m_pObject,
               (this->m_DstRes->pObject).m_pObject,
               (this->m_Signature->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
               ).
               super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name);
    if (pTexViewVk0.m_pObject != (TextureViewVkImpl *)0x0) {
      pRVar8 = this->m_DstRes;
      if ((((pRVar8->pObject).m_pObject == (IDeviceObject *)0x0) ||
          ((BindInfo->Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) !=
           SET_SHADER_RESOURCE_FLAG_NONE)) ||
         (this->m_ResDesc->VarType == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC)) {
        pSVar3 = this->m_ResourceCache;
        pRVar11 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                  ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                               *)this->m_Signature);
        msg._M_string_length = (size_type)pTexViewVk0;
        msg._M_dataplus._M_p._0_4_ = (uint)*(undefined8 *)this->m_Attribs & 0xffff;
        msg._M_dataplus._M_p._4_4_ = this->m_ArrayIndex;
        pTexViewVk0.m_pObject = (TextureViewVkImpl *)0x0;
        pBufferViewVk.m_pObject = (BufferViewVkImpl *)0x0;
        msg.field_2._M_allocated_capacity = 0;
        msg.field_2._8_8_ = 0;
        ShaderResourceCacheVk::SetResource
                  (pSVar3,(pRVar11->m_LogicalVkDevice).
                          super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,(uint)((ulong)*(undefined8 *)this->m_Attribs >> 0x3e) & 1,
                   this->m_DstResCacheOffset,(SetResourceInfo *)&msg);
        RefCntAutoPtr<Diligent::IDeviceObject>::Release
                  ((RefCntAutoPtr<Diligent::IDeviceObject> *)&msg._M_string_length);
        RefCntAutoPtr<Diligent::IDeviceObject>::Release
                  ((RefCntAutoPtr<Diligent::IDeviceObject> *)&pBufferViewVk);
      }
      else {
        RefCntAutoPtr<Diligent::IDeviceObject>::RefCntAutoPtr
                  ((RefCntAutoPtr<Diligent::IDeviceObject> *)&msg,
                   (IDeviceObject *)pTexViewVk0.m_pObject);
        pIVar2 = (pRVar8->pObject).m_pObject;
        pIVar4 = (IDeviceObject *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p);
        RefCntAutoPtr<Diligent::IDeviceObject>::Release
                  ((RefCntAutoPtr<Diligent::IDeviceObject> *)&msg);
        if (pIVar2 != pIVar4) {
          FormatString<char[64]>
                    (&msg,(char (*) [64])
                          "Binding another object to a non-dynamic variable is not allowed");
          DebugAssertionFailed
                    ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),
                     "UpdateCachedResource",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
                     ,0x192);
          std::__cxx11::string::~string((string *)&msg);
        }
      }
    }
    RefCntAutoPtr<Diligent::TopLevelASVkImpl>::Release
              ((RefCntAutoPtr<Diligent::TopLevelASVkImpl> *)&pTexViewVk0);
    return;
  default:
    pBufferViewVk.m_pObject._0_4_ = (uint)DVar1;
    FormatString<char[23],unsigned_int>
              (&msg,(Diligent *)"Unknown resource type ",(char (*) [23])&pBufferViewVk,
               (uint *)in_RCX);
    DebugAssertionFailed
              ((Char *)CONCAT44(msg._M_dataplus._M_p._4_4_,(uint)msg._M_dataplus._M_p),"operator()",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderVariableManagerVk.cpp"
               ,0x176);
  }
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void BindResourceHelper::operator()(const BindResourceInfo& BindInfo) const
{
    VERIFY_EXPR(m_ArrayIndex == BindInfo.ArrayIndex);

    if (BindInfo.pObject != nullptr)
    {
        static_assert(static_cast<Uint32>(DescriptorType::Count) == 16, "Please update the switch below to handle the new descriptor type");
        switch (m_DstRes.Type)
        {
            case DescriptorType::UniformBuffer:
            case DescriptorType::UniformBufferDynamic:
                CacheUniformBuffer(BindInfo);
                break;

            case DescriptorType::StorageBuffer:
            case DescriptorType::StorageBuffer_ReadOnly:
            case DescriptorType::StorageBufferDynamic:
            case DescriptorType::StorageBufferDynamic_ReadOnly:
                CacheStorageBuffer(BindInfo);
                break;

            case DescriptorType::UniformTexelBuffer:
            case DescriptorType::StorageTexelBuffer:
            case DescriptorType::StorageTexelBuffer_ReadOnly:
                CacheTexelBuffer(BindInfo);
                break;

            case DescriptorType::StorageImage:
            case DescriptorType::SeparateImage:
            case DescriptorType::CombinedImageSampler:
                CacheImage(BindInfo);
                break;

            case DescriptorType::Sampler:
                if (!m_Attribs.IsImmutableSamplerAssigned())
                {
                    CacheSeparateSampler(BindInfo);
                }
                else
                {
                    // Immutable samplers are permanently bound into the set layout; later binding a sampler
                    // into an immutable sampler slot in a descriptor set is not allowed (13.2.1)
                    UNEXPECTED("Attempting to assign a sampler to an immutable sampler '", m_ResDesc.Name, '\'');
                }
                break;

            case DescriptorType::InputAttachment:
            case DescriptorType::InputAttachment_General:
                CacheInputAttachment(BindInfo);
                break;

            case DescriptorType::AccelerationStructure:
                CacheAccelerationStructure(BindInfo);
                break;

            default: UNEXPECTED("Unknown resource type ", static_cast<Uint32>(m_DstRes.Type));
        }
    }
    else
    {
        DEV_CHECK_ERR((m_DstRes.pObject == nullptr ||
                       m_ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC ||
                       (BindInfo.Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) != 0),
                      "Shader variable '", m_ResDesc.Name, "' is not dynamic, but is being reset to null. This is an error and may cause unpredicted behavior. ",
                      "If this is intended and you ensured proper synchronization, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. "
                      "Otherwise, use another shader resource binding instance or label the variable as dynamic.");

        m_ResourceCache.ResetResource(m_Attribs.DescrSet, m_DstResCacheOffset);
    }
}